

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  ZSTD_paramSwitch_e useRowMatchFinder;
  size_t sVar1;
  ZSTD_compressionParameters local_38;
  
  ZSTD_getCParams_internal
            (&local_38,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
  useRowMatchFinder = (local_38.windowLog < 0xf) + ZSTD_ps_enable;
  if (local_38.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    useRowMatchFinder = ZSTD_ps_disable;
  }
  sVar1 = ZSTD_sizeof_matchState(&local_38,useRowMatchFinder,1,0);
  return sVar1 + (dictSize + 7 & 0xfffffffffffffff8) + 0x39c0;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}